

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int predict_skip_txfm(MACROBLOCK *x,BLOCK_SIZE bsize,int64_t *dist,int reduced_tx_set)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  aom_bit_depth_t bit_depth;
  uint32_t uVar5;
  MB_MODE_INFO *pMVar6;
  int16_t iVar7;
  int16_t iVar8;
  int i;
  int iVar9;
  ulong uVar10;
  int64_t iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  undefined7 in_register_00000031;
  int col;
  TxfmParam param;
  tran_low_t coefs [1024];
  int16_t *local_10b0;
  TxfmParam local_1088;
  long local_1070;
  long local_1068;
  int local_1060 [1036];
  
  uVar14 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  bVar1 = block_size_wide[uVar14];
  uVar10 = (ulong)bVar1;
  bVar2 = block_size_high[uVar14];
  iVar7 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
  iVar11 = av1_pixel_diff_dist(x,0,0,0,bsize,bsize,(uint *)0x0);
  *dist = iVar11;
  lVar15 = (long)(short)((uint)(int)iVar7 >> 3);
  uVar16 = (ulong)(lVar15 * lVar15) >> 3;
  if ((x->txfm_search_params).skip_txfm_level < 2) {
    uVar19 = (uint)bVar2;
    if ((long)uVar16 < (iVar11 / (long)uVar10) / (long)(ulong)uVar19) {
      uVar18 = 0;
    }
    else {
      local_1088.tx_size = ""[uVar14];
      iVar3 = tx_size_high[local_1088.tx_size];
      iVar4 = tx_size_wide[local_1088.tx_size];
      local_1088.tx_type = '\0';
      bit_depth = (x->e_mbd).bd;
      local_1088.is_hbd = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
      local_1088.lossless = 0;
      pMVar6 = *(x->e_mbd).mi;
      if ((pMVar6->field_0xa7 & 0x80) == 0) {
        uVar18 = (uint)('\0' < pMVar6->ref_frame[0]);
      }
      else {
        uVar18 = 1;
      }
      local_1088.bd = bit_depth;
      local_1088.tx_set_type = av1_get_ext_tx_set_type(local_1088.tx_size,uVar18,reduced_tx_set);
      lVar15 = 0;
      if (bit_depth != AOM_BITS_8) {
        lVar15 = (ulong)(bit_depth != AOM_BITS_10) + 1;
      }
      uVar5 = skip_pred_threshold[lVar15][uVar14];
      local_10b0 = x->plane[0].src_diff;
      local_1068 = (long)iVar4;
      iVar8 = av1_ac_quant_QTX(x->qindex,0,bit_depth);
      local_1070 = uVar10 * (long)iVar3;
      for (iVar9 = 0; uVar18 = (uint)((int)uVar19 <= iVar9), iVar9 < (int)uVar19;
          iVar9 = iVar9 + iVar3) {
        for (lVar15 = 0; lVar15 < (long)uVar10; lVar15 = lVar15 + local_1068) {
          av1_fwd_txfm(local_10b0 + lVar15,local_1060,(uint)bVar1,&local_1088);
          iVar13 = -local_1060[0];
          if (0 < local_1060[0]) {
            iVar13 = local_1060[0];
          }
          if ((int)iVar7 * uVar5 <= (uint)(iVar13 << 7)) {
            return uVar18;
          }
          lVar12 = 1;
          while (lVar12 < (long)iVar4 * (long)iVar3) {
            iVar13 = local_1060[lVar12];
            iVar17 = -iVar13;
            if (0 < iVar13) {
              iVar17 = iVar13;
            }
            lVar12 = lVar12 + 1;
            if ((int)iVar8 * uVar5 <= (uint)(iVar17 << 7)) {
              return uVar18;
            }
          }
        }
        local_10b0 = local_10b0 + local_1070;
      }
    }
  }
  else {
    uVar18 = (uint)(iVar11 <= (long)uVar16);
  }
  return uVar18;
}

Assistant:

static int predict_skip_txfm(MACROBLOCK *x, BLOCK_SIZE bsize, int64_t *dist,
                             int reduced_tx_set) {
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const MACROBLOCKD *xd = &x->e_mbd;
  const int16_t dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd);

  *dist = av1_pixel_diff_dist(x, 0, 0, 0, bsize, bsize, NULL);

  const int64_t mse = *dist / bw / bh;
  // Normalized quantizer takes the transform upscaling factor (8 for tx size
  // smaller than 32) into account.
  const int16_t normalized_dc_q = dc_q >> 3;
  const int64_t mse_thresh = (int64_t)normalized_dc_q * normalized_dc_q / 8;
  // For faster early skip decision, use dist to compare against threshold so
  // that quality risk is less for the skip=1 decision. Otherwise, use mse
  // since the fwd_txfm coeff checks will take care of quality
  // TODO(any): Use dist to return 0 when skip_txfm_level is 1
  int64_t pred_err = (txfm_params->skip_txfm_level >= 2) ? *dist : mse;
  // Predict not to skip when error is larger than threshold.
  if (pred_err > mse_thresh) return 0;
  // Return as skip otherwise for aggressive early skip
  else if (txfm_params->skip_txfm_level >= 2)
    return 1;

  const int max_tx_size = max_predict_sf_tx_size[bsize];
  const int tx_h = tx_size_high[max_tx_size];
  const int tx_w = tx_size_wide[max_tx_size];
  DECLARE_ALIGNED(32, tran_low_t, coefs[32 * 32]);
  TxfmParam param;
  param.tx_type = DCT_DCT;
  param.tx_size = max_tx_size;
  param.bd = xd->bd;
  param.is_hbd = is_cur_buf_hbd(xd);
  param.lossless = 0;
  param.tx_set_type = av1_get_ext_tx_set_type(
      param.tx_size, is_inter_block(xd->mi[0]), reduced_tx_set);
  const int bd_idx = (xd->bd == 8) ? 0 : ((xd->bd == 10) ? 1 : 2);
  const uint32_t max_qcoef_thresh = skip_pred_threshold[bd_idx][bsize];
  const int16_t *src_diff = x->plane[0].src_diff;
  const int n_coeff = tx_w * tx_h;
  const int16_t ac_q = av1_ac_quant_QTX(x->qindex, 0, xd->bd);
  const uint32_t dc_thresh = max_qcoef_thresh * dc_q;
  const uint32_t ac_thresh = max_qcoef_thresh * ac_q;
  for (int row = 0; row < bh; row += tx_h) {
    for (int col = 0; col < bw; col += tx_w) {
      av1_fwd_txfm(src_diff + col, coefs, bw, &param);
      // Operating on TX domain, not pixels; we want the QTX quantizers
      const uint32_t dc_coef = (((uint32_t)abs(coefs[0])) << 7);
      if (dc_coef >= dc_thresh) return 0;
      for (int i = 1; i < n_coeff; ++i) {
        const uint32_t ac_coef = (((uint32_t)abs(coefs[i])) << 7);
        if (ac_coef >= ac_thresh) return 0;
      }
    }
    src_diff += tx_h * bw;
  }
  return 1;
}